

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fy-emit.c
# Opt level: O0

fy_token * fy_node_value_token(fy_node *fyn)

{
  byte bVar1;
  fy_token *local_20;
  fy_token *fyt;
  fy_node *fyn_local;
  
  if (fyn == (fy_node *)0x0) {
    fyn_local = (fy_node *)0x0;
  }
  else {
    bVar1 = fyn->field_0x34 & 3;
    if ((fyn->field_0x34 & 3) == 0) {
      local_20 = (fyn->field_12).scalar;
    }
    else if (bVar1 == 1) {
      local_20 = (fyn->field_13).sequence_start;
    }
    else if (bVar1 == 2) {
      local_20 = (fyn->field_13).sequence_start;
    }
    else {
      local_20 = (fy_token *)0x0;
    }
    fyn_local = (fy_node *)local_20;
  }
  return (fy_token *)fyn_local;
}

Assistant:

struct fy_token *fy_node_value_token(struct fy_node *fyn) {
    struct fy_token *fyt;

    if (!fyn)
        return NULL;

    switch (fyn->type) {
        case FYNT_SCALAR:
            fyt = fyn->scalar;
            break;
        case FYNT_SEQUENCE:
            fyt = fyn->sequence_start;
            break;
        case FYNT_MAPPING:
            fyt = fyn->mapping_start;
            break;
        default:
            fyt = NULL;
            break;
    }

    return fyt;
}